

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int breada(bstring b,bNread readPtr,void *parm)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  if ((((b != (bstring)0x0) && (0 < b->mlen)) &&
      (uVar5 = b->slen, readPtr != (bNread)0x0 && uVar5 <= (uint)b->mlen)) &&
     (iVar1 = balloc(b,uVar5 + 0x11), iVar1 == 0)) {
    iVar1 = uVar5 + 0x10;
    do {
      sVar4 = (*readPtr)(b->data + uVar5,1,(long)(int)(iVar1 - uVar5),parm);
      uVar5 = (int)sVar4 + uVar5;
      b->slen = uVar5;
      if ((int)uVar5 < iVar1) {
        b->data[(int)uVar5] = '\0';
        return 0;
      }
      iVar2 = 0x400;
      if (iVar1 < 0x400) {
        iVar2 = iVar1;
      }
      iVar3 = balloc(b,iVar2 + iVar1 + 1);
      iVar1 = iVar2 + iVar1;
    } while (iVar3 == 0);
  }
  return -1;
}

Assistant:

int breada (bstring b, bNread readPtr, void * parm) {
int i, l, n;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || readPtr == NULL) return BSTR_ERR;

	i = b->slen;
	for (n=i+16; ; n += ((n < BS_BUFF_SZ) ? n : BS_BUFF_SZ)) {
		if (BSTR_OK != balloc (b, n + 1)) return BSTR_ERR;
		l = (int) readPtr ((void *) (b->data + i), 1, n - i, parm);
		i += l;
		b->slen = i;
		if (i < n) break;
	}

	b->data[i] = (unsigned char) '\0';
	return 0;
}